

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals,false,false>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  sel_t sVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      iVar8 = SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals,false,false,false,true>
                        (ldata,rdata,sel,count,mask,(SelectionVector *)0x0,false_sel);
      return iVar8;
    }
    if (count + 0x3f < 0x40) {
      iVar8 = 0;
    }
    else {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar8 = 0;
      uVar15 = 0;
      uVar16 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar10 = uVar16 + 0x40;
          if (count <= uVar16 + 0x40) {
            uVar10 = count;
          }
LAB_0040fcec:
          uVar9 = uVar16;
          if (uVar16 < uVar10) {
            psVar2 = sel->sel_vector;
            psVar3 = true_sel->sel_vector;
            uVar14 = uVar16 << 4 | 8;
            do {
              uVar9 = uVar16;
              if (psVar2 != (sel_t *)0x0) {
                uVar9 = (ulong)psVar2[uVar16];
              }
              lVar4 = *(long *)((long)ldata + (uVar14 - 8));
              lVar5 = *(long *)((long)&ldata->lower + uVar14);
              lVar6 = *(long *)((long)rdata + (uVar14 - 8));
              lVar7 = *(long *)((long)&rdata->lower + uVar14);
              psVar3[iVar8] = (sel_t)uVar9;
              iVar8 = iVar8 + (lVar5 != lVar7 || lVar4 != lVar6);
              uVar16 = uVar16 + 1;
              uVar14 = uVar14 + 0x10;
              uVar9 = uVar10;
            } while (uVar10 != uVar16);
          }
        }
        else {
          uVar14 = puVar1[uVar15];
          uVar10 = uVar16 + 0x40;
          if (count <= uVar16 + 0x40) {
            uVar10 = count;
          }
          uVar9 = uVar10;
          if (uVar14 != 0) {
            if (uVar14 == 0xffffffffffffffff) goto LAB_0040fcec;
            uVar9 = uVar16;
            if (uVar16 < uVar10) {
              psVar2 = sel->sel_vector;
              psVar3 = true_sel->sel_vector;
              uVar13 = uVar16 << 4 | 8;
              uVar12 = 0;
              do {
                if (psVar2 == (sel_t *)0x0) {
                  sVar11 = (int)uVar16 + (int)uVar12;
                }
                else {
                  sVar11 = psVar2[uVar16 + uVar12];
                }
                if ((uVar14 >> (uVar12 & 0x3f) & 1) == 0) {
                  uVar9 = 0;
                }
                else {
                  uVar9 = (ulong)(*(long *)((long)&ldata->lower + uVar13) !=
                                  *(long *)((long)&rdata->lower + uVar13) ||
                                 *(long *)((long)ldata + (uVar13 - 8)) !=
                                 *(long *)((long)rdata + (uVar13 - 8)));
                }
                psVar3[iVar8] = sVar11;
                iVar8 = iVar8 + uVar9;
                uVar12 = uVar12 + 1;
                uVar13 = uVar13 + 0x10;
                uVar9 = uVar10;
              } while ((uVar16 - uVar10) + uVar12 != 0);
            }
          }
        }
        uVar15 = uVar15 + 1;
        uVar16 = uVar9;
      } while (uVar15 != count + 0x3f >> 6);
    }
  }
  else {
    iVar8 = SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NotEquals,false,false,true,true>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
  }
  return iVar8;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}